

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jama_lu.h
# Opt level: O2

Array2D<double> * __thiscall
JAMA::LU<double>::permute_copy
          (Array2D<double> *__return_storage_ptr__,LU<double> *this,Array2D<double> *A,
          Array1D<int> *piv,int j0,int j1)

{
  uint m;
  int *piVar1;
  double **ppdVar2;
  double **ppdVar3;
  ulong uVar4;
  long lVar5;
  int j;
  long lVar6;
  ulong uVar7;
  
  m = piv->n_;
  TNT::Array2D<double>::Array2D(__return_storage_ptr__,m,(j1 - j0) + 1);
  uVar4 = 0;
  uVar7 = (ulong)m;
  if ((int)m < 1) {
    uVar7 = uVar4;
  }
  for (; uVar4 != uVar7; uVar4 = uVar4 + 1) {
    piVar1 = piv->data_;
    ppdVar2 = (A->v_).data_;
    ppdVar3 = (__return_storage_ptr__->v_).data_;
    lVar5 = 0;
    for (lVar6 = (long)j0; lVar6 <= j1; lVar6 = lVar6 + 1) {
      *(double *)((long)ppdVar3[uVar4] + lVar5) = ppdVar2[piVar1[uVar4]][lVar6];
      lVar5 = lVar5 + 8;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<Real> permute_copy(const Array2D<Real> &A, 
   			const Array1D<int> &piv, int j0, int j1)
	{
		int piv_length = piv.dim();

		Array2D<Real> X(piv_length, j1-j0+1);


         for (int i = 0; i < piv_length; i++) 
            for (int j = j0; j <= j1; j++) 
               X[i][j-j0] = A[piv[i]][j];

		return X;
	}